

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O0

void __thiscall
QHttp2ProtocolHandler::finishStream
          (QHttp2ProtocolHandler *this,QHttp2Stream *stream,ConnectionType connectionType)

{
  bool bVar1;
  State SVar2;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar3;
  QHttpNetworkRequestPrivate *pQVar4;
  int in_EDX;
  QHttp2Stream *in_RSI;
  QHttp2Stream **in_RDI;
  long in_FS_OFFSET;
  int statusCode;
  QHttpNetworkReply *httpReply;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *pair;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QHttp2Stream *in_stack_00000098;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff70;
  int line;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  QHttpNetworkReply *object;
  undefined4 in_stack_ffffffffffffff98;
  QHttp2ProtocolHandler *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb8;
  Http2Error in_stack_ffffffffffffffcc;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  SVar2 = QHttp2Stream::state(in_RSI);
  if (SVar2 != Closed) {
    QHttp2Stream::sendRST_STREAM
              ((QHttp2Stream *)CONCAT44(in_EDX,in_stack_ffffffffffffff98),in_stack_ffffffffffffffcc)
    ;
  }
  ppVar3 = QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::operator[]
                     ((QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *
                      )CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_RDI);
  object = ppVar3->second;
  if (object != (QHttpNetworkReply *)0x0) {
    in_stack_ffffffffffffff84 = QHttpNetworkReply::statusCode((QHttpNetworkReply *)0x2d34fd);
    if ((in_stack_ffffffffffffff84 == 0x191) || (in_stack_ffffffffffffff84 == 0x197)) {
      handleAuthorization(in_stack_ffffffffffffffa8,in_stack_00000098);
      goto LAB_002d3669;
    }
    QObject::disconnect((QObject *)in_stack_ffffffffffffff70,
                        (QObject *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                        (char *)0x2d353c);
    pQVar4 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                       ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)in_stack_ffffffffffffff70)
    ;
    if ((pQVar4->needResendWithCredentials & 1U) == 0) {
      if (in_EDX == 1) {
        QHttpNetworkReply::finished((QHttpNetworkReply *)0x2d3564);
      }
      else {
        QMetaObject::invokeMethod<void(QHttpNetworkReply::*)()>
                  (object,(offset_in_QHttpNetworkReply_to_subr *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (ConnectionType)((ulong)in_RDI >> 0x20));
      }
    }
  }
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QtPrivateLogging::QT_HTTP2();
  anon_unknown.dwarf_657c77::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffff70,
             (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  while( true ) {
    line = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_657c77::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2d35e8);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)in_RDI,line,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (char *)0x2d35fe);
    QMessageLogger::debug();
    in_stack_ffffffffffffff70 =
         (QLoggingCategoryMacroHolder<(QtMsgType)0> *)
         QDebug::operator<<((QDebug *)object,in_stack_ffffffffffffffb8);
    QHttp2Stream::streamID(in_RSI);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    QDebug::operator<<((QDebug *)object,in_stack_ffffffffffffffb8);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc8);
    local_10 = local_10 & 0xffffffffffffff00;
  }
  QObject::deleteLater();
LAB_002d3669:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2ProtocolHandler::finishStream(QHttp2Stream *stream, Qt::ConnectionType connectionType)
{
    if (stream->state() != QHttp2Stream::State::Closed)
        stream->sendRST_STREAM(CANCEL);

    auto &pair = requestReplyPairs[stream];
    auto *httpReply = pair.second;
    if (httpReply) {
        int statusCode = httpReply->statusCode();
        if (statusCode == 401 || statusCode == 407) {
            // handleAuthorization will either re-send the request or
            // finishWithError. In either case we don't want to emit finished
            // here.
            handleAuthorization(stream);
            return;
        }

        httpReply->disconnect(this);

        if (!pair.first.d->needResendWithCredentials) {
            if (connectionType == Qt::DirectConnection)
                emit httpReply->finished();
            else
                QMetaObject::invokeMethod(httpReply, &QHttpNetworkReply::finished, connectionType);
        }
    }

    qCDebug(QT_HTTP2) << "stream" << stream->streamID() << "closed";
    stream->deleteLater();
}